

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

void xmlParseExternalSubset(xmlParserCtxtPtr ctxt,xmlChar *ExternalID,xmlChar *SystemID)

{
  int iVar1;
  bool bVar2;
  xmlDocPtr pxVar3;
  xmlDtdPtr pxVar4;
  int oldInputNr;
  xmlChar *SystemID_local;
  xmlChar *ExternalID_local;
  xmlParserCtxtPtr ctxt_local;
  
  xmlCtxtInitializeLate(ctxt);
  xmlDetectEncoding(ctxt);
  if ((((*ctxt->input->cur == '<') && (ctxt->input->cur[1] == '?')) && (ctxt->input->cur[2] == 'x'))
     && ((ctxt->input->cur[3] == 'm' && (ctxt->input->cur[4] == 'l')))) {
    xmlParseTextDecl(ctxt);
  }
  if (ctxt->myDoc == (xmlDocPtr)0x0) {
    pxVar3 = xmlNewDoc("1.0");
    ctxt->myDoc = pxVar3;
    if (ctxt->myDoc == (xmlDocPtr)0x0) {
      xmlErrMemory(ctxt);
      return;
    }
    ctxt->myDoc->properties = 0x40;
  }
  if (((ctxt->myDoc != (xmlDocPtr)0x0) && (ctxt->myDoc->intSubset == (_xmlDtd *)0x0)) &&
     (pxVar4 = xmlCreateIntSubset(ctxt->myDoc,(xmlChar *)0x0,ExternalID,SystemID),
     pxVar4 == (xmlDtdPtr)0x0)) {
    xmlErrMemory(ctxt);
  }
  ctxt->inSubset = 2;
  iVar1 = ctxt->inputNr;
  xmlSkipBlankCharsPE(ctxt);
  while( true ) {
    if ((*ctxt->input->cur != '\0') || (bVar2 = false, iVar1 < ctxt->inputNr)) {
      bVar2 = ctxt->disableSAX < 2;
    }
    if (!bVar2) break;
    if (((ctxt->input->flags & 0x40U) == 0) &&
       ((long)ctxt->input->end - (long)ctxt->input->cur < 0xfa)) {
      xmlParserGrow(ctxt);
    }
    if (((*ctxt->input->cur == '<') && (ctxt->input->cur[1] == '!')) && (ctxt->input->cur[2] == '[')
       ) {
      xmlParseConditionalSections(ctxt);
    }
    else {
      if ((*ctxt->input->cur != '<') ||
         ((ctxt->input->cur[1] != '!' && (ctxt->input->cur[1] != '?')))) {
        xmlFatalErr(ctxt,XML_ERR_EXT_SUBSET_NOT_FINISHED,(char *)0x0);
        xmlHaltParser(ctxt);
        return;
      }
      xmlParseMarkupDecl(ctxt);
    }
    xmlSkipBlankCharsPE(ctxt);
    if ((ctxt->input->flags & 0x40U) == 0) {
      xmlParserShrink(ctxt);
    }
  }
  while (iVar1 < ctxt->inputNr) {
    xmlPopPE(ctxt);
  }
  if (*ctxt->input->cur != '\0') {
    xmlFatalErr(ctxt,XML_ERR_EXT_SUBSET_NOT_FINISHED,(char *)0x0);
  }
  return;
}

Assistant:

void
xmlParseExternalSubset(xmlParserCtxtPtr ctxt, const xmlChar *ExternalID,
                       const xmlChar *SystemID) {
    int oldInputNr;

    xmlCtxtInitializeLate(ctxt);

    xmlDetectEncoding(ctxt);

    if (CMP5(CUR_PTR, '<', '?', 'x', 'm', 'l')) {
	xmlParseTextDecl(ctxt);
    }
    if (ctxt->myDoc == NULL) {
        ctxt->myDoc = xmlNewDoc(BAD_CAST "1.0");
	if (ctxt->myDoc == NULL) {
	    xmlErrMemory(ctxt);
	    return;
	}
	ctxt->myDoc->properties = XML_DOC_INTERNAL;
    }
    if ((ctxt->myDoc != NULL) && (ctxt->myDoc->intSubset == NULL) &&
        (xmlCreateIntSubset(ctxt->myDoc, NULL, ExternalID, SystemID) == NULL)) {
        xmlErrMemory(ctxt);
    }

    ctxt->inSubset = 2;
    oldInputNr = ctxt->inputNr;

    SKIP_BLANKS_PE;
    while (((RAW != 0) || (ctxt->inputNr > oldInputNr)) &&
           (!PARSER_STOPPED(ctxt))) {
	GROW;
        if ((RAW == '<') && (NXT(1) == '!') && (NXT(2) == '[')) {
            xmlParseConditionalSections(ctxt);
        } else if ((RAW == '<') && ((NXT(1) == '!') || (NXT(1) == '?'))) {
            xmlParseMarkupDecl(ctxt);
        } else {
            xmlFatalErr(ctxt, XML_ERR_EXT_SUBSET_NOT_FINISHED, NULL);
            xmlHaltParser(ctxt);
            return;
        }
        SKIP_BLANKS_PE;
        SHRINK;
    }

    while (ctxt->inputNr > oldInputNr)
        xmlPopPE(ctxt);

    if (RAW != 0) {
	xmlFatalErr(ctxt, XML_ERR_EXT_SUBSET_NOT_FINISHED, NULL);
    }
}